

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::perceiveVisual(HierarchicalTaskNetworkComponent *this)

{
  Engram *pEVar1;
  undefined8 in_RAX;
  mapped_type *pmVar2;
  __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_> _Var3;
  undefined1 *puVar4;
  undefined8 uStack_38;
  
  pEVar1 = (this->state).memory.shortTermMemory.
           super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (undefined1 *)
           ((long)&(((this->state).memory.shortTermMemory.
                     super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
                     super__Vector_impl_data._M_start)->stimulus).field_3 + 8);
  uStack_38 = in_RAX;
  do {
    if ((Engram *)(puVar4 + -0x18) == pEVar1) {
      return;
    }
    if ((*(int *)(puVar4 + 0x10) == 1) && (*(int *)(puVar4 + 0x14) < 1)) {
      if ((((anon_union_16_2_91a068c6_for_Stimulus_3 *)(puVar4 + -8))->visual).tag == Person) {
        uStack_38 = CONCAT44(3,(undefined4)uStack_38);
        pmVar2 = std::
                 map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                 ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                               *)&this->state,(key_type *)((long)&uStack_38 + 4));
        if (*pmVar2 != false) goto LAB_001394d6;
      }
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<AI::Actor**,std::vector<AI::Actor*,std::allocator<AI::Actor*>>>,__gnu_cxx::__ops::_Iter_equals_val<AI::Actor*const>>
                        ((this->state).actorsToIgnore.
                         super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->state).actorsToIgnore.
                         super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,puVar4);
      if (_Var3._M_current ==
          (this->state).actorsToIgnore.super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        addEngramToLocus(this,(Engram *)(puVar4 + -0x18));
      }
    }
LAB_001394d6:
    puVar4 = puVar4 + 0x30;
  } while( true );
}

Assistant:

void HierarchicalTaskNetworkComponent::perceiveVisual()
{
	for (auto& engram : state.memory.shortTermMemory)
	{
		if (engram.type != EngramType::Saw)
			continue;

		if (engram.age > 0)
			continue;

		if (engram.stimulus.visual.tag == VisualTag::Person
			&& state.current.flags[WorldStateIdentifier::PlayerIdentified])		
			continue;

		if (std::find(begin(state.actorsToIgnore), end(state.actorsToIgnore), engram.stimulus.visual.target)
			== end(state.actorsToIgnore))
		{
			addEngramToLocus(engram);
		}		
	}	
}